

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
slang::ast::FmtHelpers::formatArgs_abi_cxx11_
          (string_view formatString,SourceLocation loc,Scope *scope,EvalContext *context,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args,
          bool isStringLiteral)

{
  SourceRange range;
  bool bVar1;
  iterator iVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDI
  ;
  Scope *in_R8;
  EvalContext *in_R9;
  byte in_stack_00000010;
  undefined1 in_stack_00000050 [16];
  undefined1 in_stack_00000060 [16];
  undefined1 in_stack_00000070 [16];
  function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)>
  in_stack_00000090;
  bool parseOk;
  bool ok;
  iterator argIt;
  string result;
  anon_class_16_2_839514d5 getRange;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  EvalContext *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 uVar3;
  DiagCode code;
  function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)> local_108;
  anon_class_56_7_22752c04 local_f8;
  function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
  local_c0 [2];
  anon_class_8_1_6971b95b local_a0;
  function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)> local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  byte local_72;
  bool local_71;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_70;
  string local_68;
  anon_class_16_2_839514d5 local_48;
  bool local_31;
  EvalContext *local_30;
  Scope *local_28;
  SourceLocation local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_31 = (bool)(in_stack_00000010 & 1);
  local_48.isStringLiteral = &local_31;
  local_48.loc = &local_20;
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RSI;
  uStack_10 = in_RDX;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  local_70._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 (in_stack_fffffffffffffe78);
  local_71 = true;
  local_88 = local_18;
  uStack_80 = uStack_10;
  local_a0.result = &local_68;
  function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)>::
  function_ref<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_FmtHelpers_cpp:241:23)>
            (&local_98,&local_a0);
  local_f8.scope = local_28;
  local_f8.result = &local_68;
  local_f8.getRange = &local_48;
  local_f8.argIt = &local_70;
  local_f8.context = local_30;
  local_f8.ok = &local_71;
  function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
  ::
  function_ref<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_FmtHelpers_cpp:242:9)>
            (local_c0,&local_f8);
  code = SUB84((ulong)&local_31 >> 0x20,0);
  function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)>::
  function_ref<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_FmtHelpers_cpp:275:9)>
            (&local_108,(anon_class_24_3_b2223563 *)&stack0xfffffffffffffee0);
  local_72 = SFormat::parse((string_view)in_stack_00000070,
                            (function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)>
                             )in_stack_00000060,
                            (function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
                             )in_stack_00000050,in_stack_00000090);
  iVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                    (in_stack_fffffffffffffe88);
  bVar1 = __gnu_cxx::
          operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                    ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      *)local_108.callable,
                     (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      *)local_108.callback);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108.callable;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    uVar3 = 0x16000b;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator*(&local_70);
    range.startLoc._4_4_ = uVar3;
    range.startLoc._0_4_ = in_stack_fffffffffffffed0;
    range.endLoc = (SourceLocation)iVar2._M_current;
    EvalContext::addDiag(in_stack_fffffffffffffec8,code,range);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108.callable;
  }
  local_71 = (local_71 & 1U & local_72 & 1) != 0;
  if (local_71) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108.callback);
  }
  else {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(in_RDI);
  }
  std::__cxx11::string::~string(this);
  return in_RDI;
}

Assistant:

std::optional<std::string> FmtHelpers::formatArgs(std::string_view formatString, SourceLocation loc,
                                                  const Scope& scope, EvalContext& context,
                                                  const std::span<const Expression* const>& args,
                                                  bool isStringLiteral) {
    auto getRange = [&](size_t offset, size_t len) {
        // If this is not a string literal, we can't meaningfully get an offset.
        if (!isStringLiteral)
            return SourceRange{loc, loc};

        SourceLocation sl = loc + offset;
        return SourceRange{sl, sl + len};
    };

    std::string result;
    auto argIt = args.begin();

    bool ok = true;
    bool parseOk = SFormat::parse(
        formatString, [&](std::string_view text) { result += text; },
        [&](char spec, size_t offset, size_t len, const SFormat::FormatOptions& options) {
            if (formatSpecialArg(spec, scope, result))
                return;

            SourceRange range = getRange(offset, len);
            if (argIt == args.end()) {
                // If we've run out of arguments, this is an error.
                context.addDiag(diag::FormatNoArgument, range) << spec;
                ok = false;
                return;
            }

            auto arg = *argIt++;
            if (arg->kind == ExpressionKind::EmptyArgument) {
                // Empty arguments aren't allowed for format args.
                context.addDiag(diag::FormatEmptyArg, arg->sourceRange) << spec << range;
                ok = false;
                return;
            }

            if (!checkArgType(context, *arg, spec, range)) {
                ok = false;
                return;
            }

            auto&& value = arg->eval(context);
            if (!value) {
                ok = false;
                return;
            }

            SFormat::formatArg(result, value, *arg->type, spec, options, arg->isImplicitString());
        },
        [&](DiagCode code, size_t offset, size_t len, std::optional<char> specifier) {
            // If this is from a string literal format string, we already checked
            // the string at expression creation time, so don't re-issue diagnostics.
            if (isStringLiteral)
                return;

            auto& diag = context.addDiag(code, getRange(offset, len));
            if (specifier)
                diag << *specifier;
        });

    // Leftover arguments are invalid (all must be consumed by the format string).
    if (argIt != args.end())
        context.addDiag(diag::FormatTooManyArgs, (*argIt)->sourceRange);

    ok &= parseOk;
    if (!ok)
        return std::nullopt;

    return result;
}